

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O1

uchar * base64_decode(char *data,size_t input_length,size_t *output_length)

{
  size_t __size;
  size_t sVar1;
  char *pcVar2;
  uchar *puVar3;
  int i;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  
  if (decoding_table == (char *)0x0) {
    pcVar2 = (char *)malloc(0x100);
    lVar4 = 0;
    decoding_table = pcVar2;
    do {
      pcVar2[(byte)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar4]] =
           (char)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
  }
  if ((input_length & 3) == 0) {
    sVar1 = (input_length >> 2) * 3;
    *output_length = sVar1;
    if (data[input_length - 1] == '=') {
      *output_length = sVar1 - 1;
    }
    if (data[input_length - 2] == '=') {
      *output_length = *output_length - 1;
    }
    __size = *output_length;
    puVar3 = (uchar *)malloc(__size);
    pcVar2 = decoding_table;
    if (puVar3 != (uchar *)0x0) {
      if (input_length == 0) {
        return puVar3;
      }
      uVar5 = 0;
      iVar7 = 0;
      do {
        iVar8 = 0;
        if ((long)data[uVar5] != 0x3d) {
          iVar8 = (int)pcVar2[data[uVar5]] << 0x12;
        }
        iVar10 = 0;
        iVar6 = 0;
        if ((long)data[uVar5 + 1] != 0x3d) {
          iVar6 = (int)pcVar2[data[uVar5 + 1]] << 0xc;
        }
        if ((long)data[uVar5 + 2] != 0x3d) {
          iVar10 = (int)pcVar2[data[uVar5 + 2]] << 6;
        }
        iVar11 = 0;
        if ((long)data[uVar5 + 3] != 0x3d) {
          iVar11 = (int)pcVar2[data[uVar5 + 3]];
        }
        iVar8 = iVar6 + iVar8 + iVar10 + iVar11;
        uVar9 = (ulong)iVar7;
        if (uVar9 < __size) {
          iVar7 = iVar7 + 1;
          puVar3[uVar9] = (uchar)((uint)iVar8 >> 0x10);
        }
        uVar9 = (ulong)iVar7;
        if (uVar9 < __size) {
          iVar7 = iVar7 + 1;
          puVar3[uVar9] = (uchar)((uint)iVar8 >> 8);
        }
        uVar9 = (ulong)iVar7;
        if (uVar9 < __size) {
          iVar7 = iVar7 + 1;
          puVar3[uVar9] = (uchar)iVar8;
        }
        uVar5 = uVar5 + 4;
      } while (uVar5 < input_length);
      return puVar3;
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *base64_decode(const char *data,
                             size_t input_length,
                             size_t *output_length) {

    if (decoding_table == NULL) build_decoding_table();

    if (input_length % 4 != 0) return NULL;

    *output_length = input_length / 4 * 3;
    if (data[input_length - 1] == '=') (*output_length)--;
    if (data[input_length - 2] == '=') (*output_length)--;

    unsigned char *decoded_data = malloc(*output_length);
    if (decoded_data == NULL) return NULL;

    for (int i = 0, j = 0; i < input_length;) {

        uint32_t sextet_a = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_b = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_c = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_d = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];

        uint32_t triple = (sextet_a << 3 * 6)
        + (sextet_b << 2 * 6)
        + (sextet_c << 1 * 6)
        + (sextet_d << 0 * 6);

        if (j < *output_length) decoded_data[j++] = (triple >> 2 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 1 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 0 * 8) & 0xFF;
    }

    return decoded_data;
}